

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Room.cpp
# Opt level: O0

void __thiscall Room::Room(Room *this,RoomID idnum,string *i_description)

{
  string *i_description_local;
  RoomID idnum_local;
  Room *this_local;
  
  this->_vptr_Room = (_func_int **)&PTR_describe_abi_cxx11__0014ad80;
  this->ID = idnum;
  std::__cxx11::string::string((string *)&this->description);
  std::
  vector<std::unique_ptr<Entity,_std::default_delete<Entity>_>,_std::allocator<std::unique_ptr<Entity,_std::default_delete<Entity>_>_>_>
  ::vector(&this->entities);
  std::vector<RoomObject,_std::allocator<RoomObject>_>::vector(&this->objects);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::unordered_map(&this->exits);
  std::__cxx11::string::operator=((string *)&this->description,(string *)i_description);
  return;
}

Assistant:

Room::Room(RoomID idnum, std::string i_description) : ID(idnum)
{
  description = i_description;
}